

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowViewportThumbnails(void)

{
  ImGuiViewportP **ppIVar1;
  ImRect viewport_draw_bb;
  ImGuiViewportP *viewport;
  int n_1;
  ImVec2 off;
  ImVec2 p;
  int n;
  ImRect bb_full;
  float SCALE;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_00000140;
  ImGuiViewportP *in_stack_00000148;
  ImDrawList *in_stack_00000150;
  ImRect *in_stack_ffffffffffffff48;
  ImRect *in_stack_ffffffffffffff50;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImGuiViewportP *local_60;
  int local_54;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  int local_28;
  ImRect local_24;
  undefined4 local_14;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = GImGui->CurrentWindow;
  local_14 = 0x3e000000;
  ImRect::ImRect(in_stack_ffffffffffffff50);
  for (local_28 = 0; local_28 < (local_8->Viewports).Size; local_28 = local_28 + 1) {
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_28);
    local_38 = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1cb760);
    ImRect::Add(&local_24,&local_38);
  }
  local_40 = (local_10->DC).CursorPos;
  local_50 = ::operator*(&in_stack_ffffffffffffff48->Min,0.0);
  local_48 = ::operator-(&in_stack_ffffffffffffff48->Min,(ImVec2 *)0x1cb7d9);
  for (local_54 = 0; local_54 < (local_8->Viewports).Size; local_54 = local_54 + 1) {
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_54);
    local_60 = *ppIVar1;
    local_80 = ::operator*(&in_stack_ffffffffffffff48->Min,0.0);
    local_78 = ::operator+(&in_stack_ffffffffffffff48->Min,(ImVec2 *)0x1cb850);
    ::operator+(&in_stack_ffffffffffffff48->Min,(ImVec2 *)0x1cb86b);
    in_stack_ffffffffffffff70 = ::operator*(&in_stack_ffffffffffffff48->Min,0.0);
    local_88 = ::operator+(&in_stack_ffffffffffffff48->Min,(ImVec2 *)0x1cb899);
    ImRect::ImRect(&local_70,&local_78,&local_88);
    RenderViewportThumbnail(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  }
  ImRect::GetSize(in_stack_ffffffffffffff48);
  ::operator*(&in_stack_ffffffffffffff48->Min,0.0);
  Dummy((ImVec2 *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void ImGui::ShowViewportThumbnails()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We don't display full monitor bounds (we could, but it often looks awkward), instead we display just enough to cover all of our viewports.
    float SCALE = 1.0f / 8.0f;
    ImRect bb_full;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    bb_full.Add(GetPlatformMonitorMainRect(g.PlatformIO.Monitors[n]));
    for (int n = 0; n < g.Viewports.Size; n++)
        bb_full.Add(g.Viewports[n]->GetRect());
    ImVec2 p = window->DC.CursorPos;
    ImVec2 off = p - bb_full.Min * SCALE;
    //for (int n = 0; n < g.PlatformIO.Monitors.Size; n++)
    //    window->DrawList->AddRect(off + g.PlatformIO.Monitors[n].MainPos * SCALE, off + (g.PlatformIO.Monitors[n].MainPos + g.PlatformIO.Monitors[n].MainSize) * SCALE, ImGui::GetColorU32(ImGuiCol_Border));
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        ImRect viewport_draw_bb(off + (viewport->Pos) * SCALE, off + (viewport->Pos + viewport->Size) * SCALE);
        RenderViewportThumbnail(window->DrawList, viewport, viewport_draw_bb);
    }
    ImGui::Dummy(bb_full.GetSize() * SCALE);
}